

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

UBool icu_63::isEquivalentDateRule
                (int32_t month,int32_t weekInMonth,int32_t dayOfWeek,DateTimeRule *dtrule)

{
  int32_t iVar1;
  TimeRuleType TVar2;
  DateRuleType DVar3;
  int32_t ruleDOM;
  DateTimeRule *dtrule_local;
  int32_t dayOfWeek_local;
  int32_t weekInMonth_local;
  int32_t month_local;
  
  iVar1 = DateTimeRule::getRuleMonth(dtrule);
  if ((month == iVar1) && (iVar1 = DateTimeRule::getRuleDayOfWeek(dtrule), dayOfWeek == iVar1)) {
    TVar2 = DateTimeRule::getTimeRuleType(dtrule);
    if (TVar2 == WALL_TIME) {
      DVar3 = DateTimeRule::getDateRuleType(dtrule);
      if ((DVar3 == DOW) && (iVar1 = DateTimeRule::getRuleWeekInMonth(dtrule), iVar1 == weekInMonth)
         ) {
        weekInMonth_local._3_1_ = '\x01';
      }
      else {
        iVar1 = DateTimeRule::getRuleDayOfMonth(dtrule);
        DVar3 = DateTimeRule::getDateRuleType(dtrule);
        if (DVar3 == DOW_GEQ_DOM) {
          if ((iVar1 % 7 == 1) && ((iVar1 + 6) / 7 == weekInMonth)) {
            return '\x01';
          }
          if (((month != 1) && ((*(int *)(MONTHLENGTH + (long)month * 4) - iVar1) % 7 == 6)) &&
             (weekInMonth == -(((*(int *)(MONTHLENGTH + (long)month * 4) - iVar1) + 1) / 7))) {
            return '\x01';
          }
        }
        DVar3 = DateTimeRule::getDateRuleType(dtrule);
        if (DVar3 == DOW_LEQ_DOM) {
          if ((iVar1 % 7 == 0) && (iVar1 / 7 == weekInMonth)) {
            return '\x01';
          }
          if (((month != 1) && ((*(int *)(MONTHLENGTH + (long)month * 4) - iVar1) % 7 == 0)) &&
             (weekInMonth == -((*(int *)(MONTHLENGTH + (long)month * 4) - iVar1) / 7 + 1))) {
            return '\x01';
          }
        }
        weekInMonth_local._3_1_ = '\0';
      }
    }
    else {
      weekInMonth_local._3_1_ = '\0';
    }
  }
  else {
    weekInMonth_local._3_1_ = '\0';
  }
  return weekInMonth_local._3_1_;
}

Assistant:

static UBool isEquivalentDateRule(int32_t month, int32_t weekInMonth, int32_t dayOfWeek, const DateTimeRule *dtrule) {
    if (month != dtrule->getRuleMonth() || dayOfWeek != dtrule->getRuleDayOfWeek()) {
        return FALSE;
    }
    if (dtrule->getTimeRuleType() != DateTimeRule::WALL_TIME) {
        // Do not try to do more intelligent comparison for now.
        return FALSE;
    }
    if (dtrule->getDateRuleType() == DateTimeRule::DOW
            && dtrule->getRuleWeekInMonth() == weekInMonth) {
        return TRUE;
    }
    int32_t ruleDOM = dtrule->getRuleDayOfMonth();
    if (dtrule->getDateRuleType() == DateTimeRule::DOW_GEQ_DOM) {
        if (ruleDOM%7 == 1 && (ruleDOM + 6)/7 == weekInMonth) {
            return TRUE;
        }
        if (month != UCAL_FEBRUARY && (MONTHLENGTH[month] - ruleDOM)%7 == 6
                && weekInMonth == -1*((MONTHLENGTH[month]-ruleDOM+1)/7)) {
            return TRUE;
        }
    }
    if (dtrule->getDateRuleType() == DateTimeRule::DOW_LEQ_DOM) {
        if (ruleDOM%7 == 0 && ruleDOM/7 == weekInMonth) {
            return TRUE;
        }
        if (month != UCAL_FEBRUARY && (MONTHLENGTH[month] - ruleDOM)%7 == 0
                && weekInMonth == -1*((MONTHLENGTH[month] - ruleDOM)/7 + 1)) {
            return TRUE;
        }
    }
    return FALSE;
}